

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

void __thiscall despot::ChainState::Init(ChainState *this,int num_mdp_states,int num_mdp_actions)

{
  ulong uVar1;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  long lVar2;
  
  this_00 = &this->mdp_transitions_;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_00,(long)num_mdp_states);
  if (0 < num_mdp_states) {
    uVar1 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this_00->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar1,(long)num_mdp_actions);
      if (0 < num_mdp_actions) {
        lVar2 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (*(long *)&(this_00->
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar1].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar2),(long)num_mdp_states);
          memset(*(void **)(*(long *)&(this_00->
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar1].
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data + lVar2),0,
                 (ulong)(uint)num_mdp_states * 8);
          lVar2 = lVar2 + 0x18;
        } while ((ulong)(uint)num_mdp_actions * 0x18 != lVar2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)num_mdp_states);
  }
  return;
}

Assistant:

void ChainState::Init(int num_mdp_states, int num_mdp_actions) {
	mdp_transitions_.resize(num_mdp_states);
	for (int state = 0; state < num_mdp_states; state++) {
		mdp_transitions_[state].resize(num_mdp_actions);
		for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
			mdp_transitions_[state][action].resize(num_mdp_states);
			for (int s = 0; s < num_mdp_states; s++)
				mdp_transitions_[state][action][s] = 0;
		}
	}
}